

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void update_thr_fact(int (*factor_buf) [169],THR_MODES best_mode_index,THR_MODES mode_start,
                    THR_MODES mode_end,BLOCK_SIZE min_size,BLOCK_SIZE max_size,
                    int max_rd_thresh_factor)

{
  int *piVar1;
  int local_2c;
  int *fact;
  BLOCK_SIZE bs;
  THR_MODES mode;
  BLOCK_SIZE max_size_local;
  BLOCK_SIZE min_size_local;
  THR_MODES mode_end_local;
  THR_MODES mode_start_local;
  THR_MODES best_mode_index_local;
  int (*factor_buf_local) [169];
  
  for (mode = mode_start; bs = min_size, mode < mode_end; mode = mode + '\x01') {
    for (; bs <= max_size; bs = bs + BLOCK_4X8) {
      piVar1 = factor_buf[bs] + mode;
      if (mode == best_mode_index) {
        *piVar1 = *piVar1 - (*piVar1 >> 4);
      }
      else {
        if (*piVar1 + 1 < max_rd_thresh_factor) {
          local_2c = *piVar1 + 1;
        }
        else {
          local_2c = max_rd_thresh_factor;
        }
        *piVar1 = local_2c;
      }
    }
  }
  return;
}

Assistant:

static inline void update_thr_fact(int (*factor_buf)[MAX_MODES],
                                   THR_MODES best_mode_index,
                                   THR_MODES mode_start, THR_MODES mode_end,
                                   BLOCK_SIZE min_size, BLOCK_SIZE max_size,
                                   int max_rd_thresh_factor) {
  for (THR_MODES mode = mode_start; mode < mode_end; ++mode) {
    for (BLOCK_SIZE bs = min_size; bs <= max_size; ++bs) {
      int *const fact = &factor_buf[bs][mode];
      if (mode == best_mode_index) {
        *fact -= (*fact >> RD_THRESH_LOG_DEC_FACTOR);
      } else {
        *fact = AOMMIN(*fact + RD_THRESH_INC, max_rd_thresh_factor);
      }
    }
  }
}